

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_serpent.cpp
# Opt level: O0

int AF_A_SerpentHumpDecide(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *pAVar1;
  int iVar2;
  FState *newstate;
  bool bVar3;
  bool local_5e;
  bool local_5b;
  FSoundID local_58;
  FName local_54;
  void *local_50;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  VMValue *pVStack_20;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pVStack_20 = param;
  param_local = (VMValue *)stack;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0x59,
                  "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar3) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0x59,
                  "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  stateowner = (AActor *)(param->field_0).field_1.a;
  local_5b = true;
  if (stateowner != (AActor *)0x0) {
    local_5b = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_5b == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                  ,0x59,
                  "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 1)) {
      bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x59,
                    "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    stateinfo = (FStateParamInfo *)pVStack_20[(int)self].field_0.field_1.a;
    local_5e = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_5e = DObject::IsKindOf((DObject *)stateinfo,AActor::RegistrationInfo.MyClass);
    }
    if (local_5e == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x59,
                    "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
  else {
    stateinfo = (FStateParamInfo *)stateowner;
  }
  self._0_4_ = (int)self + 1;
  if (((int)self < ret_local._4_4_) && (pVStack_20[(int)self].field_0.field_3.Type != 0xff)) {
    bVar3 = false;
    if ((pVStack_20[(int)self].field_0.field_3.Type == '\x03') &&
       (bVar3 = true, pVStack_20[(int)self].field_0.field_1.atag != 8)) {
      bVar3 = pVStack_20[(int)self].field_0.field_1.a == (void *)0x0;
    }
    if (!bVar3) {
      __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_serpent.cpp"
                    ,0x59,
                    "int AF_A_SerpentHumpDecide(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
    local_50 = pVStack_20[(int)self].field_0.field_1.a;
  }
  else {
    local_50 = (void *)0x0;
  }
  if (stateowner->MissileState == (FState *)0x0) {
    iVar2 = FRandom::operator()(&pr_serpenthump);
    if (3 < iVar2) {
      return 0;
    }
  }
  else {
    iVar2 = FRandom::operator()(&pr_serpenthump);
    if (0x1e < iVar2) {
      return 0;
    }
    iVar2 = FRandom::operator()(&pr_serpenthump);
    if (iVar2 < 0x28) {
      AActor::SetState(stateowner,stateowner->MeleeState,false);
      return 0;
    }
  }
  bVar3 = AActor::CheckMeleeRange(stateowner);
  if (!bVar3) {
    if ((stateowner->MissileState == (FState *)0x0) ||
       (iVar2 = FRandom::operator()(&pr_serpenthump), 0x7f < iVar2)) {
      pAVar1 = stateowner;
      FName::FName(&local_54,"Hump");
      newstate = AActor::FindState(pAVar1,&local_54);
      AActor::SetState(pAVar1,newstate,false);
      pAVar1 = stateowner;
      FSoundID::FSoundID(&local_58,"SerpentActive");
      S_Sound(pAVar1,4,&local_58,1.0,1.0);
    }
    else {
      AActor::SetState(stateowner,stateowner->MeleeState,false);
    }
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SerpentHumpDecide)
{
	PARAM_ACTION_PROLOGUE;

	if (self->MissileState != NULL)
	{
		if (pr_serpenthump() > 30)
		{
			return 0;
		}
		else if (pr_serpenthump() < 40)
		{ // Missile attack
			self->SetState (self->MeleeState);
			return 0;
		}
	}
	else if (pr_serpenthump() > 3)
	{
		return 0;
	}
	if (!self->CheckMeleeRange ())
	{ // The hump shouldn't occur when within melee range
		if (self->MissileState != NULL && pr_serpenthump() < 128)
		{
			self->SetState (self->MeleeState);
		}
		else
		{	
			self->SetState (self->FindState ("Hump"));
			S_Sound (self, CHAN_BODY, "SerpentActive", 1, ATTN_NORM);
		}
	}
	return 0;
}